

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.hpp
# Opt level: O0

vector<rect,_std::allocator<rect>_> * __thiscall
WalkerManager::GetRectFromManager(WalkerManager *this)

{
  value_type *__x;
  value_type *pvVar1;
  reference pvVar2;
  vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_> *in_RSI;
  vector<rect,_std::allocator<rect>_> *in_RDI;
  rect r_t;
  Mrect r;
  int i;
  vector<rect,_std::allocator<rect>_> *retcts;
  size_type in_stack_ffffffffffffff88;
  vector<Mrect,_std::allocator<Mrect>_> *in_stack_ffffffffffffff90;
  vector<rect,_std::allocator<rect>_> *this_00;
  rect local_44;
  undefined8 local_28;
  undefined8 uStack_20;
  int local_18;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<rect,_std::allocator<rect>_>::vector((vector<rect,_std::allocator<rect>_> *)0x12a80f);
  local_18 = 0;
  while( true ) {
    __x = (value_type *)(long)local_18;
    pvVar1 = (value_type *)
             std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::size
                       (in_RSI);
    if (pvVar1 <= __x) break;
    in_stack_ffffffffffffff90 =
         (vector<Mrect,_std::allocator<Mrect>_> *)
         std::vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_>::at
                   ((vector<std::shared_ptr<MWakler>,_std::allocator<std::shared_ptr<MWakler>_>_> *)
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<MWakler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x12a85c);
    pvVar2 = std::vector<Mrect,_std::allocator<Mrect>_>::back(in_stack_ffffffffffffff90);
    local_28._0_4_ = pvVar2->x1;
    local_28._4_4_ = pvVar2->y1;
    uStack_20._0_4_ = pvVar2->x2;
    uStack_20._4_4_ = pvVar2->y2;
    rect::rect(&local_44,(undefined4)local_28,local_28._4_4_,(undefined4)uStack_20,uStack_20._4_4_);
    std::vector<rect,_std::allocator<rect>_>::push_back(this_00,__x);
    local_18 = local_18 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<rect> GetRectFromManager()
    {
        std::vector<rect> retcts;
        //retcts.resize(walkers.size());

        for(int i=0; i<walkers.size(); ++i)
        {
            Mrect r = walkers.at(i)->mRects.back();
            rect r_t{r.x1, r.y1, r.x2, r.y2};
            retcts.push_back(r_t);
        }
        return retcts;
    }